

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Expression
dynet::detail::
f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
          (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *xs)

{
  uint uVar1;
  ComputationGraph *this;
  pointer pEVar2;
  VariableIndex VVar3;
  pointer pEVar4;
  Expression EVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_39;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  pEVar4 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this = pEVar4->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
             (long)(xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4,&local_39);
  pEVar2 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar4 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
    *local_38._M_impl.super__Vector_impl_data._M_start = pEVar4->i;
    local_38._M_impl.super__Vector_impl_data._M_start =
         local_38._M_impl.super__Vector_impl_data._M_start + 1;
  }
  VVar3 = ComputationGraph::
          add_function<dynet::AffineTransform,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  uVar1 = this->graph_id;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  EVar5.graph_id = uVar1;
  EVar5.i = VVar3;
  EVar5.pg = this;
  return EVar5;
}

Assistant:

Expression f(const T& xs) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis));
}